

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O0

BmsOutOfRangeAccessException * __thiscall
BmsOutOfRangeAccessException::Message_abi_cxx11_(BmsOutOfRangeAccessException *this)

{
  type_info *this_00;
  char *pcVar1;
  ostream *poVar2;
  long in_RSI;
  stringstream local_1a0 [8];
  stringstream os;
  ostream local_190 [384];
  BmsOutOfRangeAccessException *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  this_00 = BmsWithCauseClassException::GetCauseClass((BmsWithCauseClassException *)(in_RSI + 8));
  pcVar1 = std::type_info::name(this_00);
  poVar2 = std::operator<<(local_190,pcVar1);
  std::operator<<(poVar2,"  - Tried to access over supporting range of BMS file format.");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string
BmsOutOfRangeAccessException::Message( void ) const
{
  std::stringstream os;
  os << this->GetCauseClass().name() << "  - Tried to access over supporting range of BMS file format.";
  return os.str();
}